

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O1

bool __thiscall
CScript::IsWitnessProgram
          (CScript *this,int *version,vector<unsigned_char,_std::allocator<unsigned_char>_> *program
          )

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  CScript *pCVar5;
  int iVar6;
  long in_FS_OFFSET;
  allocator_type local_31;
  void *local_30 [2];
  long local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (this->super_CScriptBase)._size;
  uVar2 = uVar4 - 0x1d;
  if (uVar4 < 0x1d) {
    uVar2 = uVar4;
  }
  if (0xffffffd8 < uVar2 - 0x2b) {
    pCVar5 = this;
    if (0x1c < uVar4) {
      pCVar5 = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
    }
    bVar1 = (pCVar5->super_CScriptBase)._union.direct[0];
    if (bVar1 == 0 || 0xef < (byte)(bVar1 + 0x9f)) {
      bVar3 = false;
      iVar6 = 0;
      if ((byte)(pCVar5->super_CScriptBase)._union.direct[1] + 2 == uVar2) {
        if (bVar1 != 0) {
          if (0xf < bVar1 - 0x51) {
            __assert_fail("opcode >= OP_1 && opcode <= OP_16",
                          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/script.h"
                          ,0x1fe,"static int CScript::DecodeOP_N(opcodetype)");
          }
          iVar6 = bVar1 - 0x50;
        }
        *version = iVar6;
        uVar4 = (this->super_CScriptBase)._size;
        if (0x1c < uVar4) {
          this = (CScript *)(this->super_CScriptBase)._union.indirect_contents.indirect;
          uVar4 = uVar4 - 0x1d;
        }
        std::vector<unsigned_char,std::allocator<unsigned_char>>::
        vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                  ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_30,
                   (uchar *)((long)&(this->super_CScriptBase)._union + 2),
                   (uchar *)((long)&(this->super_CScriptBase)._union + (long)(int)uVar4),&local_31);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                  (program,(vector<unsigned_char,std::allocator<unsigned_char>> *)local_30);
        if (local_30[0] != (void *)0x0) {
          operator_delete(local_30[0],local_20 - (long)local_30[0]);
        }
        bVar3 = true;
      }
      goto LAB_007a0cc8;
    }
  }
  bVar3 = false;
LAB_007a0cc8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool CScript::IsWitnessProgram(int& version, std::vector<unsigned char>& program) const
{
    if (this->size() < 4 || this->size() > 42) {
        return false;
    }
    if ((*this)[0] != OP_0 && ((*this)[0] < OP_1 || (*this)[0] > OP_16)) {
        return false;
    }
    if ((size_t)((*this)[1] + 2) == this->size()) {
        version = DecodeOP_N((opcodetype)(*this)[0]);
        program = std::vector<unsigned char>(this->begin() + 2, this->end());
        return true;
    }
    return false;
}